

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bssplitstrcb(bStream *s,const_bstring splitStr,_func_int_void_ptr_int_const_bstring *cb,
                void *parm)

{
  int iVar1;
  bstring b1;
  undefined1 local_58 [8];
  tagbstring t;
  int local_40;
  int ret;
  int p;
  int i;
  bstring buff;
  void *parm_local;
  _func_int_void_ptr_int_const_bstring *cb_local;
  const_bstring splitStr_local;
  bStream *s_local;
  
  local_40 = 0;
  t.data._4_4_ = 0;
  if ((((cb == (_func_int_void_ptr_int_const_bstring *)0x0) || (s == (bStream *)0x0)) ||
      (s->readFnPtr == (bNread)0x0)) || ((splitStr == (const_bstring)0x0 || (splitStr->slen < 0))))
  {
    s_local._4_4_ = -1;
  }
  else if (splitStr->slen == 1) {
    s_local._4_4_ = bssplitscb(s,splitStr,cb,parm);
  }
  else {
    b1 = bfromcstr(anon_var_dwarf_23d28 + 0x10);
    if (b1 == (bstring)0x0) {
      s_local._4_4_ = -1;
    }
    else if (splitStr->slen == 0) {
      while (iVar1 = bsreada(b1,s,0x100), -1 < iVar1) {
        t.data._4_4_ = (*cb)(parm,0,b1);
        if (t.data._4_4_ < 0) {
          bdestroy(b1);
          return t.data._4_4_;
        }
        b1->slen = 0;
      }
      bdestroy(b1);
      s_local._4_4_ = 0;
    }
    else {
      do {
        while (t.data._4_4_ = binstr(b1,0,splitStr), -1 < t.data._4_4_) {
          t._0_8_ = b1->data;
          local_58._0_4_ = -1;
          iVar1 = t.data._4_4_ + splitStr->slen;
          local_58._4_4_ = t.data._4_4_;
          t.data._4_4_ = (*cb)(parm,local_40,(const_bstring)local_58);
          if (t.data._4_4_ < 0) goto LAB_0019a49b;
          local_40 = iVar1 + local_40;
          bdelete(b1,0,iVar1);
        }
        bsreada(b1,s,0x100);
        iVar1 = bseof(s);
      } while (iVar1 == 0);
      t.data._4_4_ = (*cb)(parm,local_40,b1);
      if (0 < t.data._4_4_) {
        t.data._4_4_ = 0;
      }
LAB_0019a49b:
      bdestroy(b1);
      s_local._4_4_ = t.data._4_4_;
    }
  }
  return s_local._4_4_;
}

Assistant:

int bssplitstrcb (struct bStream * s, const_bstring splitStr,
	int (* cb) (void * parm, int ofs, const_bstring entry), void * parm) {
	bstring buff;
	int i = 0, p = 0, ret = 0;

	if (cb == NULL || s == NULL || s->readFnPtr == NULL
	 || splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;

	if (splitStr->slen == 1) return bssplitscb (s, splitStr, cb, parm);

	if (NULL == (buff = bfromcstr (""))) return BSTR_ERR;

	if (splitStr->slen == 0) {
		for (i=0; bsreada (buff, s, BSSSC_BUFF_LEN) >= 0; i++) {
			if ((ret = cb (parm, 0, buff)) < 0) {
				bdestroy (buff);
				return ret;
			}
			buff->slen = 0;
		}
		bdestroy (buff);
		return BSTR_OK;
	} else {
		for (;;) {
			if ((ret = binstr (buff, 0, splitStr)) >= 0) {
				struct tagbstring t;
				blk2tbstr (t, buff->data, ret);
				i = ret + splitStr->slen;
				if ((ret = cb (parm, p, &t)) < 0) break;
				p += i;
				bdelete (buff, 0, i);
			} else {
				bsreada (buff, s, BSSSC_BUFF_LEN);
				if (bseof (s)) {
					if ((ret = cb (parm, p, buff)) > 0) ret = 0;
					break;
				}
			}
		}
	}

	bdestroy (buff);
	return ret;
}